

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_memory_manager.cpp
# Opt level: O2

void __thiscall
duckdb::TemporaryMemoryManager::UpdateState
          (TemporaryMemoryManager *this,ClientContext *context,
          TemporaryMemoryState *temporary_memory_state)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  
  UpdateConfiguration(this,context);
  uVar4 = (temporary_memory_state->minimum_reservation).super___atomic_base<unsigned_long>._M_i;
  uVar1 = (temporary_memory_state->remaining_size).super___atomic_base<unsigned_long>._M_i;
  if (uVar4 < uVar1) {
    uVar1 = uVar4;
  }
  if ((temporary_memory_state->remaining_size).super___atomic_base<unsigned_long>._M_i == 0) {
    this->reservation =
         this->reservation -
         (temporary_memory_state->reservation).super___atomic_base<unsigned_long>._M_i;
    uVar1 = 0;
  }
  else {
    if ((context->config).force_external != true) {
      if (this->has_temporary_directory != false) {
        if ((this->reservation + uVar1) -
            (temporary_memory_state->reservation).super___atomic_base<unsigned_long>._M_i <
            this->memory_limit) {
          uVar4 = (temporary_memory_state->remaining_size).super___atomic_base<unsigned_long>._M_i;
          uVar2 = this->query_max_memory;
          if (uVar4 < this->query_max_memory) {
            uVar2 = uVar4;
          }
          uVar3 = ((temporary_memory_state->reservation).super___atomic_base<unsigned_long>._M_i -
                  this->reservation) + this->memory_limit;
          auVar5._8_4_ = (int)(uVar3 >> 0x20);
          auVar5._0_8_ = uVar3;
          auVar5._12_4_ = 0x45300000;
          dVar6 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * 0.9;
          uVar4 = (ulong)dVar6;
          uVar4 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
          if (uVar2 < uVar4) {
            uVar4 = uVar2;
          }
          if (uVar3 <= uVar4) {
            uVar4 = uVar3;
          }
          if ((uVar1 < uVar4) && (uVar1 = uVar4, this->memory_limit < this->remaining_size)) {
            uVar1 = ComputeReservation(this,temporary_memory_state);
          }
        }
        this->reservation =
             this->reservation -
             (temporary_memory_state->reservation).super___atomic_base<unsigned_long>._M_i;
        LOCK();
        (temporary_memory_state->reservation).super___atomic_base<unsigned_long>._M_i = uVar1;
        UNLOCK();
        goto LAB_01ac316f;
      }
      uVar1 = (temporary_memory_state->remaining_size).super___atomic_base<unsigned_long>._M_i;
    }
    this->reservation =
         this->reservation -
         (temporary_memory_state->reservation).super___atomic_base<unsigned_long>._M_i;
  }
  LOCK();
  (temporary_memory_state->reservation).super___atomic_base<unsigned_long>._M_i = uVar1;
  UNLOCK();
LAB_01ac316f:
  this->reservation =
       this->reservation +
       (temporary_memory_state->reservation).super___atomic_base<unsigned_long>._M_i;
  return;
}

Assistant:

void TemporaryMemoryManager::UpdateState(ClientContext &context, TemporaryMemoryState &temporary_memory_state) {
	UpdateConfiguration(context);

	// The lower bound for the reservation of this state is either the minimum reservation or the remaining size
	const auto lower_bound =
	    MinValue(temporary_memory_state.GetMinimumReservation(), temporary_memory_state.GetRemainingSize());

	if (temporary_memory_state.GetRemainingSize() == 0) {
		// Sometimes set to 0 to denote end of state (before actually deleting the state)
		SetReservation(temporary_memory_state, 0);
	} else if (context.config.force_external) {
		// We're forcing external processing. Give it the minimum
		SetReservation(temporary_memory_state, lower_bound);
	} else if (!has_temporary_directory) {
		// We cannot offload, so we cannot limit memory usage. Set reservation equal to the remaining size
		SetReservation(temporary_memory_state, temporary_memory_state.GetRemainingSize());
	} else if (reservation - temporary_memory_state.GetReservation() + lower_bound >= memory_limit) {
		// We overshot. Set reservation equal to the minimum
		SetReservation(temporary_memory_state, lower_bound);
	} else {
		// The upper bound for the reservation of this state is the minimum of:
		// 1. Remaining size of the state
		// 2. The max memory per query
		// 3. MAXIMUM_FREE_MEMORY_RATIO * free memory
		auto upper_bound = MinValue(temporary_memory_state.GetRemainingSize(), query_max_memory);
		const auto free_memory = memory_limit - (reservation - temporary_memory_state.GetReservation());
		upper_bound = MinValue(upper_bound,
		                       LossyNumericCast<idx_t>(MAXIMUM_FREE_MEMORY_RATIO * static_cast<double>(free_memory)));
		upper_bound = MinValue(upper_bound, free_memory);

		idx_t new_reservation;
		if (lower_bound >= upper_bound) {
			new_reservation = lower_bound;
		} else {
			new_reservation = remaining_size > memory_limit ? ComputeReservation(temporary_memory_state) : upper_bound;
		}

		SetReservation(temporary_memory_state, new_reservation);
	}

	Verify();
}